

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::RepeatedField<long>::Resize(RepeatedField<long> *this,int new_size,long *value)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  
  if (this->current_size_ < new_size) {
    Reserve(this,new_size);
    pvVar1 = this->arena_or_elements_;
    lVar2 = *value;
    for (lVar3 = (long)this->current_size_ << 3; (long)new_size * 8 != lVar3; lVar3 = lVar3 + 8) {
      *(long *)((long)pvVar1 + lVar3) = lVar2;
    }
  }
  this->current_size_ = new_size;
  return;
}

Assistant:

inline void RepeatedField<Element>::Resize(int new_size, const Element& value) {
  GOOGLE_DCHECK_GE(new_size, 0);
  if (new_size > current_size_) {
    Reserve(new_size);
    std::fill(&elements()[current_size_], &elements()[new_size], value);
  }
  current_size_ = new_size;
}